

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,int,int,char[12],char[9]>
               (ostream *out,char *fmt,int *args,int *args_1,int *args_2,char (*args_3) [12],
               char (*args_4) [9])

{
  char (*in_stack_ffffffffffffff28) [9];
  FormatListN<5> local_c0;
  char (*local_38) [12];
  char (*args_local_3) [12];
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  char *fmt_local;
  ostream *out_local;
  
  local_38 = args_3;
  args_local_3 = (char (*) [12])args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (int *)fmt;
  fmt_local = (char *)out;
  makeFormatList<int,int,int,char[12],char[9]>
            (&local_c0,(tinyformat *)args,args_1,args_2,(int *)args_3,(char (*) [12])args_4,
             in_stack_ffffffffffffff28);
  vformat(out,fmt,&local_c0.super_FormatList);
  return;
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}